

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmLocalGenerator *this_01;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_02;
  TargetDependSet *pTVar3;
  _Base_ptr p_Var4;
  cmGeneratorTarget *gt;
  cmStateSnapshot csnp;
  cmStateSnapshot tsnp;
  cmGeneratorTarget *local_b8;
  pointer local_b0;
  cmLocalGenerator *local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_88;
  cmStateSnapshot local_80;
  string local_68;
  cmStateSnapshot local_48;
  
  local_88 = &this->DirectoryTargetsMap;
  std::
  _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&local_88->_M_t);
  local_a0 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b0 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (local_a0 == local_b0) {
      return;
    }
    local_a8 = *local_a0;
    local_98 = (local_a8->GeneratorTargets).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (local_90 = (local_a8->GeneratorTargets).
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; local_90 != local_98;
        local_90 = local_90 + 1) {
      local_b8 = *local_90;
      this_01 = cmGeneratorTarget::GetLocalGenerator(local_b8);
      TVar2 = cmGeneratorTarget::GetType(local_b8);
      this_00 = local_b8;
      if (TVar2 != INTERFACE_LIBRARY) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"EXCLUDE_FROM_ALL",(allocator<char> *)&local_48);
        bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (!bVar1) {
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_68,local_a8);
          cmLocalGenerator::GetStateSnapshot(&local_48,this_01);
          while( true ) {
            bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_68);
            if (!bVar1) break;
            bVar1 = cmGlobalGenerator::IsExcluded
                              ((cmGlobalGenerator *)this,(cmStateSnapshot *)&local_68,&local_48);
            if (bVar1) break;
            this_02 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                       *)std::
                         map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                         ::operator[](local_88,(key_type *)&local_68);
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>(this_02,&local_b8);
            pTVar3 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,local_b8);
            for (p_Var4 = (pTVar3->
                          super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var4 !=
                &(pTVar3->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header;
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
              local_80.State = *(cmState **)(p_Var4 + 1);
              std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*>(this_02,(cmGeneratorTarget **)&local_80);
            }
            cmStateSnapshot::GetBuildsystemDirectoryParent(&local_80,(cmStateSnapshot *)&local_68);
            local_68._M_dataplus._M_p = (pointer)local_80.State;
          }
        }
      }
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    for (cmGeneratorTarget* gt : lg->GetGeneratorTargets()) {
      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        for (cmTargetDepend const& tgtdep : this->GetTargetDirectDepends(gt)) {
          targetSet.insert(tgtdep);
        }
      }
    }
  }
}